

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test2D.cpp
# Opt level: O0

bool tfs::localTest2d(DnnTrainer *trainer,vector<double,_std::allocator<double>_> *data,
                     vector<long,_std::allocator<long>_> *label,char *trainingName,
                     unsigned_long max_iteration)

{
  Matrix *this;
  double *pdVar1;
  long *plVar2;
  size_type sVar3;
  long lVar4;
  undefined8 in_RCX;
  double *pdVar5;
  vector<long,_std::allocator<long>_> *in_RDX;
  ulong in_R8;
  DNN_NUMERIC DVar6;
  char *level;
  undefined1 auVar7 [16];
  DNN_NUMERIC *inPtr;
  uint ii;
  DNN_NUMERIC average_loss;
  unsigned_long iterationCount;
  DNN_NUMERIC TARGET_LOSS;
  uint MAX_EPOCH;
  DNN_INTEGER *ePtr;
  unsigned_long DATA_COUNT;
  DNN_INTEGER *lPtr;
  DNN_NUMERIC *dPtr;
  Matrix *input;
  DnnTrainer *in_stack_ffffffffffffff60;
  DnnTrainer *in_stack_ffffffffffffff68;
  bool local_89;
  uint local_7c;
  double local_78;
  ulong local_70;
  long *local_48;
  double *local_40;
  bool local_1;
  
  this = DnnTrainer::getMatrixInput(in_stack_ffffffffffffff60);
  if (this == (Matrix *)0x0) {
    local_1 = report_problem("Error",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/test2D.cpp"
                             ,"localTest2d",0x8f,"Unable to obtain input matrix.");
  }
  else {
    pdVar1 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x1128a9);
    if (pdVar1 == (double *)0x0) {
      local_1 = report_problem("Error",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/test2D.cpp"
                               ,"localTest2d",0x93,"Unable to obtain input data.");
    }
    else {
      plVar2 = std::vector<long,_std::allocator<long>_>::data
                         ((vector<long,_std::allocator<long>_> *)0x1128f9);
      if (plVar2 == (long *)0x0) {
        local_1 = report_problem("Error",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/test2D.cpp"
                                 ,"localTest2d",0x97,"Unable to obtain input labels.");
      }
      else {
        sVar3 = std::vector<long,_std::allocator<long>_>::size(in_RDX);
        if (sVar3 == 0) {
          local_1 = report_problem("Error",
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/test2D.cpp"
                                   ,"localTest2d",0x9b,"Label data size < 1");
        }
        else {
          local_70 = 0;
          do {
            local_70 = local_70 + 1;
            local_78 = 0.0;
            for (local_7c = 0; local_7c < 200; local_7c = local_7c + 1) {
              local_40 = std::vector<double,_std::allocator<double>_>::data
                                   ((vector<double,_std::allocator<double>_> *)0x112a04);
              local_48 = std::vector<long,_std::allocator<long>_>::data
                                   ((vector<long,_std::allocator<long>_> *)0x112a16);
              while (local_48 < plVar2 + sVar3) {
                pdVar1 = TMatrix<double>::data(this);
                pdVar5 = local_40 + 1;
                *pdVar1 = *local_40;
                local_40 = local_40 + 2;
                pdVar1[1] = *pdVar5;
                local_48 = local_48 + 1;
                DVar6 = DnnTrainer::train(in_stack_ffffffffffffff68,
                                          (DNN_INTEGER)in_stack_ffffffffffffff60);
                local_78 = DVar6 + local_78;
              }
            }
            lVar4 = sVar3 * 200;
            auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
            auVar7._0_8_ = lVar4;
            auVar7._12_4_ = 0x45300000;
            level = (char *)(local_78 /
                            ((auVar7._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)));
            local_89 = 0.02 < (double)level && local_70 < in_R8;
          } while (local_89);
          report_message(level,(char *)0x3f947ae147ae147b,"Info ",0x12c1a6,"localTest2d",0xb3,
                         "Average loss = %f/%f. Count = %lu/%lu (%s)",local_70,in_R8,in_RCX);
          local_1 = true;
        }
      }
    }
  }
  return local_1;
}

Assistant:

static bool
    localTest2d( DnnTrainer &trainer,
                const std::vector< DNN_NUMERIC > &data,
                const std::vector< DNN_INTEGER > &label,
                const char *trainingName,
                const unsigned long max_iteration = 200 ) {
        Matrix *input = trainer.getMatrixInput();       // get the input matrix: x,y pair Matrix( 1, 1, 2 )
        if( input == 0 ) {
            return log_error( "Unable to obtain input matrix." );
        }
        const DNN_NUMERIC *dPtr = data.data();
        if( dPtr == 0 ) {
            return log_error( "Unable to obtain input data." );
        }
        const DNN_INTEGER *lPtr = label.data();
        if( lPtr == 0 ) {
            return log_error( "Unable to obtain input labels." );
        }
        const unsigned long DATA_COUNT = label.size();
        if( DATA_COUNT < 1 ) {
            return log_error( "Label data size < 1" );
        }
        const DNN_INTEGER * const ePtr = lPtr + DATA_COUNT;

        const unsigned int      MAX_EPOCH = 200;
        const DNN_NUMERIC     TARGET_LOSS = 0.02;
        unsigned long      iterationCount = 0;
        DNN_NUMERIC          average_loss = 0.0;
        do {
            iterationCount++;
            average_loss = 0.0;
            for( unsigned int ii = 0; ii < MAX_EPOCH; ii++ ) {
                dPtr = data.data();
                lPtr = label.data();
                
                while( lPtr < ePtr ) {
                    DNN_NUMERIC *inPtr = input->data();
                    *inPtr++ = *dPtr++;     // x
                    *inPtr   = *dPtr++;     // y
                    average_loss += trainer.train( *lPtr++ );
                }
            }
            average_loss /= DATA_COUNT * MAX_EPOCH;
        } while( average_loss > TARGET_LOSS && iterationCount < max_iteration );
        log_info( "Average loss = %f/%f. Count = %lu/%lu (%s)", average_loss, TARGET_LOSS, iterationCount, max_iteration, trainingName );
        return true;
    }